

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffpi4b(fitsfile *fptr,long nvals,long incre,int *values,int *status)

{
  int *in_RCX;
  long in_RDX;
  int *in_R8;
  void *in_stack_00000028;
  int *in_stack_00000030;
  void *in_stack_00000038;
  LONGLONG in_stack_00000040;
  fitsfile *in_stack_00000048;
  
  ffswap4(in_RCX,(long)in_R8);
  if (in_RDX == 4) {
    ffpbyt(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  else {
    ffpbytoff(in_stack_00000048,in_stack_00000040,(long)in_stack_00000038,(long)in_stack_00000030,
              in_stack_00000028,&fptr->HDUposition);
  }
  return *in_R8;
}

Assistant:

int ffpi4b(fitsfile *fptr, /* I - FITS file pointer                         */
           long nvals,     /* I - number of pixels in the values array      */
           long incre,     /* I - byte increment between pixels             */
           INT32BIT *values, /* I - array of values to write                */
           int *status)    /* IO - error status                             */
/*
  put (write) the array of values to the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
#if BYTESWAPPED
    ffswap4(values, nvals);    /* reverse order of bytes in each value */
#endif

    if (incre == 4)      /* write all the values at once (contiguous bytes) */

        ffpbyt(fptr, nvals * 4, values, status);

    else         /* have to write each value individually (not contiguous ) */

        ffpbytoff(fptr, 4, nvals, incre - 4, values, status);

    return(*status);
}